

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,string_view name,string_view value,
          bool ignoreDup)

{
  undefined1 auVar1 [16];
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *__source;
  anon_class_32_4_b7d0904a local_120;
  undefined1 local_100 [16];
  string local_f0;
  path local_c0;
  undefined1 local_98 [8];
  path path;
  error_code ec;
  string pathMem;
  bool ignoreDup_local;
  Option *this_local;
  string_view value_local;
  string_view name_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (Option *)value._M_len;
  value_local._M_str = (char *)name._M_len;
  pathMem.field_2._M_local_buf[0xf] = ignoreDup;
  std::__cxx11::string::string((string *)&ec._M_cat);
  if ((this->isFileName & 1U) != 0) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (!bVar2) {
      std::error_code::error_code((error_code *)&path._M_cmpts);
      std::filesystem::__cxx11::
      u8path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path,char>
                (&local_c0,(__cxx11 *)&this_local,__source);
      std::filesystem::weakly_canonical((path *)local_98,(error_code *)&local_c0);
      std::filesystem::__cxx11::path::~path(&local_c0);
      bVar2 = std::error_code::operator_cast_to_bool((error_code *)&path._M_cmpts);
      auVar1._8_8_ = value_local._M_len;
      auVar1._0_8_ = this_local;
      if (!bVar2) {
        std::filesystem::__cxx11::path::u8string(&local_f0,(path *)local_98);
        std::__cxx11::string::operator=((string *)&ec._M_cat,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        local_100 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ec._M_cat);
        auVar1 = local_100;
      }
      value_local._M_len = auVar1._8_8_;
      this_local = auVar1._0_8_;
      std::filesystem::__cxx11::path::~path((path *)local_98);
    }
  }
  local_120.name = (string_view *)&value_local._M_str;
  local_120.value = (string_view *)&this_local;
  local_120.ignoreDup = (bool *)((long)&pathMem.field_2 + 0xf);
  local_120.this = this;
  std::
  visit<slang::CommandLine::Option::set[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>&>
            (__return_storage_ptr__,&local_120,&this->storage);
  std::__cxx11::string::~string((string *)&ec._M_cat);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(string_view name, string_view value, bool ignoreDup) {
    std::string pathMem;
    if (isFileName && !value.empty()) {
        std::error_code ec;
        fs::path path = fs::weakly_canonical(fs::u8path(value), ec);
        if (!ec) {
            pathMem = path.u8string();
            value = pathMem;
        }
    }

    return std::visit(
        [&](auto&& arg) {
            if constexpr (std::is_same_v<OptionCallback, std::decay_t<decltype(arg)>>) {
                return set(arg, name, value);
            }
            else {
                if (!allowValue(*arg)) {
                    if (ignoreDup)
                        return std::string();
                    return fmt::format("more than one value provided for argument '{}'"sv, name);
                }
                return set(*arg, name, value);
            }
        },
        storage);
}